

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_functions.c
# Opt level: O3

void WebRtcIsac_AllZeroFilter(double *In,double *Coef,size_t lengthInOut,int orderCoef,double *Out)

{
  double *pdVar1;
  size_t sVar2;
  long lVar3;
  double dVar4;
  
  if (lengthInOut != 0) {
    sVar2 = 0;
    do {
      dVar4 = *In * *Coef;
      if (0 < orderCoef) {
        lVar3 = -1;
        pdVar1 = Coef + 1;
        do {
          dVar4 = dVar4 + *pdVar1 * In[lVar3];
          lVar3 = lVar3 + -1;
          pdVar1 = pdVar1 + 1;
        } while (-lVar3 != (ulong)(orderCoef + 1));
      }
      *Out = dVar4;
      Out = Out + 1;
      In = In + 1;
      sVar2 = sVar2 + 1;
    } while (sVar2 != lengthInOut);
  }
  return;
}

Assistant:

void WebRtcIsac_AllZeroFilter(double* In,
                              double* Coef,
                              size_t lengthInOut,
                              int orderCoef,
                              double* Out) {
  /* the state of filter is assumed to be in In[-1] to In[-orderCoef] */

  size_t n;
  int k;
  double tmp;

  for(n = 0; n < lengthInOut; n++)
  {
    tmp = In[0] * Coef[0];

    for(k = 1; k <= orderCoef; k++){
      tmp += Coef[k] * In[-k];
    }

    *Out++ = tmp;
    In++;
  }
}